

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_solve_lexsat(sat_solver *s,int *pLits,int nLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char local_2d;
  int iStack_28;
  lbool status;
  int iLitFail;
  int i;
  int nLits_local;
  int *pLits_local;
  sat_solver *s_local;
  
  if (nLits < 1) {
    __assert_fail("nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x861,"int sat_solver_solve_lexsat(sat_solver *, int *, int)");
  }
  sat_solver_set_literal_polarity(s,pLits,nLits);
  iVar1 = sat_solver_solve_internal(s);
  if ((char)iVar1 == '\x01') {
    for (iStack_28 = 0; iVar1 = iStack_28, iStack_28 < nLits; iStack_28 = iStack_28 + 1) {
      iVar3 = pLits[iStack_28];
      iVar2 = Abc_Lit2Var(pLits[iStack_28]);
      iVar2 = sat_solver_var_literal(s,iVar2);
      if (iVar3 != iVar2) break;
    }
    if (iStack_28 == nLits) {
      s_local._4_4_ = 1;
    }
    else {
      iStack_28 = 0;
      while ((iStack_28 <= iVar1 && (iVar3 = sat_solver_push(s,pLits[iStack_28]), iVar3 != 0))) {
        iStack_28 = iStack_28 + 1;
      }
      if (iStack_28 < iVar1 + 1) {
        local_2d = -1;
      }
      else {
        iVar3 = sat_solver_solve_internal(s);
        local_2d = (char)iVar3;
      }
      iStack_28 = iVar1;
      if (local_2d == '\x01') {
        if (iVar1 + 1 < nLits) {
          iVar1 = sat_solver_solve_lexsat(s,pLits + (long)iVar1 + 1,(nLits - iVar1) + -1);
          local_2d = (char)iVar1;
        }
      }
      else if (local_2d == -1) {
        iVar3 = Abc_LitIsCompl(pLits[iVar1]);
        if (iVar3 == 0) {
          __assert_fail("Abc_LitIsCompl(pLits[iLitFail])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                        ,0x884,"int sat_solver_solve_lexsat(sat_solver *, int *, int)");
        }
        sat_solver_pop(s);
        iVar3 = Abc_LitNot(pLits[iVar1]);
        pLits[iVar1] = iVar3;
        iVar3 = sat_solver_push(s,pLits[iVar1]);
        if (iVar3 == 0) {
          printf("sat_solver_solve_lexsat(): A satisfying assignment should exist.\n");
        }
        while (iStack_28 = iStack_28 + 1, iStack_28 < nLits) {
          iVar3 = Abc_LitRegular(pLits[iStack_28]);
          iVar3 = Abc_LitNot(iVar3);
          pLits[iStack_28] = iVar3;
        }
        if (iVar1 + 1 < nLits) {
          iVar3 = sat_solver_solve_lexsat(s,pLits + (long)iVar1 + 1,(nLits - iVar1) + -1);
          local_2d = (char)iVar3;
          iStack_28 = iVar1;
        }
        else {
          local_2d = '\x01';
          iStack_28 = iVar1;
        }
      }
      for (; -1 < iStack_28; iStack_28 = iStack_28 + -1) {
        sat_solver_pop(s);
      }
      s_local._4_4_ = (int)local_2d;
    }
  }
  else {
    s_local._4_4_ = (int)(char)iVar1;
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver_solve_lexsat( sat_solver* s, int * pLits, int nLits )
{
    int i, iLitFail = -1;
    lbool status;
    assert( nLits > 0 );
    // help the SAT solver by setting desirable polarity
    sat_solver_set_literal_polarity( s, pLits, nLits );
    // check if there exists a satisfying assignment
    status = sat_solver_solve_internal( s );
    if ( status != l_True ) // no assignment
        return status;
    // there is at least one satisfying assignment
    assert( status == l_True );
    // find the first mismatching literal
    for ( i = 0; i < nLits; i++ )
        if ( pLits[i] != sat_solver_var_literal(s, Abc_Lit2Var(pLits[i])) )
            break;
    if ( i == nLits ) // no mismatch - the current assignment is the minimum one!
        return l_True;
    // mismatch happens in literal i
    iLitFail = i;
    // create assumptions up to this literal (as in pLits) - including this literal!
    for ( i = 0; i <= iLitFail; i++ )
        if ( !sat_solver_push(s, pLits[i]) ) // can become UNSAT while adding the last assumption
            break;
    if ( i < iLitFail + 1 ) // the solver became UNSAT while adding assumptions
        status = l_False;
    else // solve under the assumptions
        status = sat_solver_solve_internal( s );
    if ( status == l_True )
    {
        // we proved that there is a sat assignment with literal (iLitFail) having polarity as in pLits
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
    }
    else if ( status == l_False )
    {
        // we proved that there is no assignment with iLitFail having polarity as in pLits
        assert( Abc_LitIsCompl(pLits[iLitFail]) ); // literal is 0 
        // (this assert may fail only if there is a sat assignment smaller than one originally given in pLits)
        // now we flip this literal (make it 1), change the last assumption
        // and contiue looking for the 000...0-assignment of other literals
        sat_solver_pop( s );
        pLits[iLitFail] = Abc_LitNot(pLits[iLitFail]);
        if ( !sat_solver_push(s, pLits[iLitFail]) )
            printf( "sat_solver_solve_lexsat(): A satisfying assignment should exist.\n" ); // because we know that the problem is satisfiable
        // update other literals to be 000...0
        for ( i = iLitFail + 1; i < nLits; i++ )
            pLits[i] = Abc_LitNot( Abc_LitRegular(pLits[i]) );
        // continue solving recursively
        if ( iLitFail + 1 < nLits )
            status = sat_solver_solve_lexsat( s, pLits + iLitFail + 1, nLits - iLitFail - 1 );
        else
            status = l_True;
    }
    // undo the assumptions
    for ( i = iLitFail; i >= 0; i-- )
        sat_solver_pop( s );
    return status;
}